

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

Bounds2f __thiscall
pbrt::RealisticCamera::BoundExitPupil(RealisticCamera *this,Float filmX0,Float filmX1)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  Float FVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  Float invBase;
  float fVar17;
  float fVar18;
  undefined4 in_XMM9_Da;
  undefined1 in_register_00001444 [12];
  Bounds2f BVar19;
  string ret;
  float local_e8;
  Float local_e4;
  float local_e0;
  float local_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b0 [32];
  MediumHandle local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  fVar18 = (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].apertureRadius;
  auVar8 = ZEXT416((uint)(fVar18 * 1.5));
  auVar9 = ZEXT416((uint)(fVar18 * -1.5));
  local_58 = vminss_avx(auVar8,auVar9);
  local_78 = local_58._0_4_;
  local_68 = vmaxss_avx(auVar8,auVar9);
  local_88 = local_68._0_4_;
  fVar17 = 0.5;
  local_c8._8_4_ = 0x7f7fffff;
  local_c8._0_8_ = 0x7f7fffff7f7fffff;
  local_c8._12_4_ = 0x7f7fffff;
  local_d8._8_4_ = 0xff7fffff;
  local_d8._0_8_ = 0xff7fffffff7fffff;
  local_d8._12_4_ = 0xff7fffff;
  fVar18 = 0.33333334;
  uVar5 = 0;
  iVar3 = 0;
  local_e8 = filmX1;
  local_e4 = filmX0;
  local_e0 = fVar18;
  local_dc = fVar17;
  fStack_84 = local_88;
  fStack_80 = local_88;
  fStack_7c = local_88;
  fStack_74 = local_78;
  fStack_70 = local_78;
  fStack_6c = local_78;
  do {
    fVar12 = ((float)(int)uVar5 + 0.5) * 9.536743e-07;
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * local_e8)),ZEXT416((uint)(1.0 - fVar12)),
                             ZEXT416((uint)local_e4));
    auVar9 = ZEXT816(0);
    if (uVar5 != 0) {
      lVar4 = 0;
      fVar12 = 1.0;
      uVar2 = uVar5;
      do {
        lVar4 = (lVar4 - uVar2 / 2) * 2 + uVar2;
        fVar12 = fVar17 * fVar12;
        bVar6 = 1 < uVar2;
        uVar2 = uVar2 / 2;
      } while (bVar6);
      auVar9._4_12_ = in_register_00001444;
      auVar9._0_4_ = in_XMM9_Da;
      auVar9 = vcvtusi2ss_avx512f(auVar9,lVar4);
      auVar9 = ZEXT416((uint)(fVar12 * auVar9._0_4_));
    }
    if (uVar5 == 0) {
      auVar13 = ZEXT816(0) << 0x40;
    }
    else {
      lVar4 = 0;
      fVar12 = 1.0;
      uVar2 = uVar5;
      do {
        lVar4 = (lVar4 - uVar2 / 3) * 3 + uVar2;
        fVar12 = fVar18 * fVar12;
        bVar6 = 2 < uVar2;
        uVar2 = uVar2 / 3;
      } while (bVar6);
      auVar13._4_12_ = in_register_00001444;
      auVar13._0_4_ = in_XMM9_Da;
      auVar13 = vcvtusi2ss_avx512f(auVar13,lVar4);
      auVar13 = ZEXT416((uint)(fVar12 * auVar13._0_4_));
    }
    auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar9);
    auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar13);
    auVar9 = vinsertps_avx(auVar9,auVar13,0x10);
    auVar14._8_4_ = 0x3f800000;
    auVar14._0_8_ = 0x3f8000003f800000;
    auVar14._12_4_ = 0x3f800000;
    auVar13 = vsubps_avx(auVar14,auVar9);
    auVar15._0_4_ = auVar9._0_4_ * local_88;
    auVar15._4_4_ = auVar9._4_4_ * fStack_84;
    auVar15._8_4_ = auVar9._8_4_ * fStack_80;
    auVar15._12_4_ = auVar9._12_4_ * fStack_7c;
    auVar1._4_4_ = fStack_74;
    auVar1._0_4_ = local_78;
    auVar1._8_4_ = fStack_70;
    auVar1._12_4_ = fStack_6c;
    auVar9 = vfmadd231ps_fma(auVar15,auVar13,auVar1);
    uVar2 = vcmpps_avx512vl(local_c8,auVar9,6);
    if (((((uVar2 & 1) != 0) || (local_d8._0_4_ < auVar9._0_4_)) || ((uVar2 >> 1 & 1) != 0)) ||
       (uVar2 = vcmpps_avx512vl(auVar9,local_d8,6), (uVar2 & 2) != 0)) {
      local_b0._0_4_ = auVar8._0_4_;
      auVar8 = vblendps_avx(ZEXT416((uint)(auVar9._0_4_ - (float)local_b0._0_4_)),auVar9,2);
      auVar8 = vmovlhps_avx(ZEXT816(0) << 0x20,auVar8);
      local_b0._4_4_ = auVar8._0_4_;
      local_b0._8_8_ = auVar8._4_8_;
      local_b0._16_4_ = auVar8._12_4_;
      local_b0._24_4_ = 0.0;
      local_90.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               )0;
      local_b0._20_4_ =
           (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].thickness;
      local_48 = auVar9;
      FVar7 = TraceLensesFromFilm(this,(Ray *)local_b0,(Ray *)0x0);
      fVar18 = local_e0;
      fVar17 = local_dc;
      auVar9 = local_48;
      if ((FVar7 != 0.0) || (NAN(FVar7))) goto LAB_003e37ac;
    }
    else {
LAB_003e37ac:
      local_c8 = vminps_avx(auVar9,local_c8);
      local_d8 = vmaxps_avx(auVar9,local_d8);
      iVar3 = iVar3 + 1;
    }
    uVar5 = uVar5 + 1;
    if (uVar5 == 0x100000) {
      if (iVar3 == 0) {
        local_c8._4_4_ = local_78;
        local_c8._0_4_ = local_78;
        auVar8._8_4_ = local_78;
        auVar8._0_4_ = local_78;
        auVar8._4_4_ = local_78;
        auVar8._12_4_ = local_78;
        local_d8._4_4_ = local_88;
        local_d8._0_4_ = local_88;
        auVar10._8_4_ = local_88;
        auVar10._0_4_ = local_88;
        auVar10._4_4_ = local_88;
        auVar10._12_4_ = local_88;
        if (LOGGING_LogLevel < 1) {
          local_b0._8_8_ = 0;
          local_b0._16_4_ = local_b0._16_4_ & 0xffffff00;
          local_d8 = auVar10;
          local_c8 = auVar8;
          local_b0._0_8_ = local_b0 + 0x10;
          detail::stringPrintfRecursive<float&,float&>
                    ((string *)local_b0,"Unable to find exit pupil in x = [%f,%f] on film.",
                     &local_e4,&local_e8);
          Log(Verbose,
              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.cpp"
              ,900,(char *)local_b0._0_8_);
          if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
            operator_delete((void *)local_b0._0_8_,CONCAT44(local_b0._20_4_,local_b0._16_4_) + 1);
          }
        }
      }
      else {
        fVar18 = ((float)local_68._0_4_ - (float)local_58._0_4_) *
                 ((float)local_68._0_4_ - (float)local_58._0_4_);
        fVar18 = fVar18 + fVar18;
        if (fVar18 < 0.0) {
          fVar18 = sqrtf(fVar18);
          uVar16 = local_d8._0_8_;
        }
        else {
          auVar8 = vsqrtss_avx(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18));
          fVar18 = auVar8._0_4_;
          uVar16 = local_d8._0_8_;
        }
        fVar18 = (fVar18 + fVar18) * 0.0009765625;
        auVar11._4_4_ = fVar18;
        auVar11._0_4_ = fVar18;
        auVar11._8_4_ = fVar18;
        auVar11._12_4_ = fVar18;
        auVar8 = vsubps_avx(local_c8,auVar11);
        local_c8._0_8_ = auVar8._0_8_;
        local_d8._0_4_ = (float)uVar16 + fVar18;
        local_d8._4_4_ = (float)((ulong)uVar16 >> 0x20) + fVar18;
      }
      BVar19.pMax.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)local_d8._0_8_;
      BVar19.pMin.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)local_c8._0_8_;
      return BVar19;
    }
  } while( true );
}

Assistant:

Bounds2f RealisticCamera::BoundExitPupil(Float filmX0, Float filmX1) const {
    Bounds2f pupilBounds;
    // Sample a collection of points on the rear lens to find exit pupil
    const int nSamples = 1024 * 1024;
    int nExitingRays = 0;
    // Compute bounding box of projection of rear element on sampling plane
    Float rearRadius = RearElementRadius();
    Bounds2f projRearBounds(Point2f(-1.5f * rearRadius, -1.5f * rearRadius),
                            Point2f(1.5f * rearRadius, 1.5f * rearRadius));

    for (int i = 0; i < nSamples; ++i) {
        // Find location of sample points on $x$ segment and rear lens element
        Point3f pFilm(Lerp((i + 0.5f) / nSamples, filmX0, filmX1), 0, 0);
        Float u[2] = {RadicalInverse(0, i), RadicalInverse(1, i)};
        Point3f pRear(Lerp(u[0], projRearBounds.pMin.x, projRearBounds.pMax.x),
                      Lerp(u[1], projRearBounds.pMin.y, projRearBounds.pMax.y),
                      LensRearZ());

        // Expand pupil bounds if ray makes it through the lens system
        if (Inside(Point2f(pRear.x, pRear.y), pupilBounds) ||
            TraceLensesFromFilm(Ray(pFilm, pRear - pFilm), nullptr)) {
            pupilBounds = Union(pupilBounds, Point2f(pRear.x, pRear.y));
            ++nExitingRays;
        }
    }

    // Return entire element bounds if no rays made it through the lens system
    if (nExitingRays == 0) {
        LOG_VERBOSE("Unable to find exit pupil in x = [%f,%f] on film.", filmX0, filmX1);
        return projRearBounds;
    }

    // Expand bounds to account for sample spacing
    pupilBounds =
        Expand(pupilBounds, 2 * Length(projRearBounds.Diagonal()) / std::sqrt(nSamples));

    return pupilBounds;
}